

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ret0.cxx
# Opt level: O2

int main(int ac,char **av)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char **ppcVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  string logarg;
  string logfile;
  string arg;
  string exename;
  CommandLineArguments args;
  string local_50 [32];
  
  cmsys::Encoding::CommandLineArguments::Main(&args,ac,av);
  iVar3 = cmsys::Encoding::CommandLineArguments::argc(&args);
  ppcVar4 = cmsys::Encoding::CommandLineArguments::argv(&args);
  std::__cxx11::string::string((string *)&exename,*ppcVar4,(allocator *)&logarg);
  logarg._M_dataplus._M_p = (pointer)&logarg.field_2;
  logarg._M_string_length = 0;
  logarg.field_2._M_local_buf[0] = '\0';
  lVar5 = std::__cxx11::string::find((char *)&exename,0x114004);
  if ((lVar5 == -1) && (lVar5 = std::__cxx11::string::find((char *)&exename,0x114019), lVar5 == -1))
  {
    bVar2 = false;
    lVar5 = std::__cxx11::string::find((char *)&exename,0x114020);
    if (lVar5 != -1) {
      bVar2 = true;
      std::__cxx11::string::assign((char *)&logarg);
    }
  }
  else {
    std::__cxx11::string::assign((char *)&logarg);
    bVar2 = false;
  }
  if (logarg._M_string_length == 0) {
LAB_0010bbe7:
    iVar6 = 0;
  }
  else {
    logfile._M_dataplus._M_p = (pointer)&logfile.field_2;
    logfile._M_string_length = 0;
    logfile.field_2._M_local_buf[0] = '\0';
    iVar6 = 0;
    uVar7 = 1;
    do {
      if ((long)iVar3 <= (long)uVar7) {
        if (logfile._M_string_length != 0) {
          std::__cxx11::string::string
                    ((string *)&arg,logfile._M_dataplus._M_p,(allocator *)local_50);
          cmsys::SystemTools::Touch(&arg,true);
          std::__cxx11::string::~string((string *)&arg);
        }
        std::__cxx11::string::~string((string *)&logfile);
        goto LAB_0010bbe7;
      }
      std::__cxx11::string::string((string *)&arg,ppcVar4[uVar7],(allocator *)local_50);
      lVar5 = std::__cxx11::string::find((string *)&arg,(ulong)&logarg);
      bVar1 = true;
      if (lVar5 == 0) {
        if (bVar2) {
          if (iVar3 - 1 == uVar7) {
            bVar1 = false;
            iVar6 = 1;
          }
          else {
            std::__cxx11::string::assign((char *)&logfile);
          }
        }
        else {
          std::__cxx11::string::substr((ulong)local_50,(ulong)&arg);
          std::__cxx11::string::operator=((string *)&logfile,local_50);
          std::__cxx11::string::~string(local_50);
        }
      }
      std::__cxx11::string::~string((string *)&arg);
      uVar7 = uVar7 + 1;
    } while (bVar1);
    std::__cxx11::string::~string((string *)&logfile);
  }
  std::__cxx11::string::~string((string *)&logarg);
  std::__cxx11::string::~string((string *)&exename);
  cmsys::Encoding::CommandLineArguments::~CommandLineArguments(&args);
  return iVar6;
}

Assistant:

int
main(int ac, char **av)
{
  cmsys::Encoding::CommandLineArguments args =
    cmsys::Encoding::CommandLineArguments::Main(ac, av);
  int argc = args.argc();
  const char* const* argv = args.argv();

  std::string exename = argv[0];
  std::string logarg;
  bool nextarg = false;

  if (exename.find("valgrind") != exename.npos)
    logarg = "--log-file=";
  else if (exename.find("purify") != exename.npos)
#ifdef _WIN32
    logarg = "/SAVETEXTDATA=";
#else
    logarg = "-log-file=";
#endif
  else if (exename.find("BC") != exename.npos)
    {
    nextarg = true;
    logarg = "/X";
    }

  if (!logarg.empty()) {
    std::string logfile;
    for (int i = 1; i < argc; i++) {
      std::string arg = argv[i];
      if (arg.find(logarg) == 0)
        {
        if (nextarg)
          {
          if (i == argc - 1)
            return 1; // invalid command line
          logfile = argv[i + 1];
          }
        else
          {
          logfile = arg.substr(logarg.length());
          }
        // keep searching, it may be overridden later to provoke an error
        }
      }

    if (!logfile.empty())
      cmSystemTools::Touch(logfile.c_str(), true);
  }

  return RETVAL;
}